

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  secp256k1_fe *in_RDX;
  secp256k1_fe *in_RSI;
  secp256k1_gej *in_RDI;
  secp256k1_ge *unaff_retaddr;
  size_t last_i;
  size_t i;
  secp256k1_fe u;
  secp256k1_fe *in_stack_ffffffffffffffa8;
  secp256k1_fe *r_00;
  secp256k1_fe *local_48;
  undefined1 local_40 [40];
  secp256k1_fe *local_18;
  
  r_00 = (secp256k1_fe *)0xffffffffffffffff;
  local_18 = in_RDX;
  for (local_48 = (secp256k1_fe *)0x0; local_48 < local_18;
      local_48 = (secp256k1_fe *)((long)local_48->n + 1)) {
    if (*(int *)((long)in_RSI + (long)local_48 * 0x80 + 0x78) == 0) {
      if (r_00 == (secp256k1_fe *)0xffffffffffffffff) {
        memcpy((uint64_t *)((long)&in_RDI->x + (long)local_48 * 0x58),
               (void *)((long)in_RSI + (long)local_48 * 0x80 + 0x50),0x28);
        r_00 = local_48;
      }
      else {
        secp256k1_fe_impl_mul(r_00,in_stack_ffffffffffffffa8,(secp256k1_fe *)0x136fde);
        r_00 = local_48;
      }
    }
    else {
      secp256k1_ge_set_infinity((secp256k1_ge *)0x136f6f);
    }
  }
  if (r_00 != (secp256k1_fe *)0xffffffffffffffff) {
    secp256k1_fe_impl_inv_var(&unaff_retaddr->x,&in_RDI->x);
    local_48 = r_00;
    while (local_48 != (secp256k1_fe *)0x0) {
      local_48 = (secp256k1_fe *)((long)local_48[-1].n + 0x27);
      if (*(int *)((long)in_RSI + (long)local_48 * 0x80 + 0x78) == 0) {
        secp256k1_fe_impl_mul(r_00,in_stack_ffffffffffffffa8,(secp256k1_fe *)0x13707f);
        secp256k1_fe_impl_mul(r_00,in_stack_ffffffffffffffa8,(secp256k1_fe *)0x1370a1);
        r_00 = local_48;
      }
    }
    memcpy((uint64_t *)((long)&in_RDI->x + (long)r_00 * 0x58),local_40,0x28);
    for (local_48 = (secp256k1_fe *)0x0; local_48 < local_18;
        local_48 = (secp256k1_fe *)((long)local_48->n + 1)) {
      if (*(int *)((long)in_RSI + (long)local_48 * 0x80 + 0x78) == 0) {
        secp256k1_ge_set_gej_zinv(unaff_retaddr,in_RDI,in_RSI);
      }
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}